

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> * __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::operator=
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this,
          ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *other)

{
  ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *other_local;
  ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (FlattenedField *)0x0;
  other->pos = (RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)0x0;
  other->endPtr = (FlattenedField *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }